

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O3

void __thiscall
icu_63::MatchInfo::MatchInfo
          (MatchInfo *this,UTimeZoneNameType nameType,int32_t matchLength,UnicodeString *tzID,
          UnicodeString *mzID)

{
  (this->id).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00487e70;
  (this->id).fUnion.fStackFields.fLengthAndFlags = 2;
  this->nameType = nameType;
  this->matchLength = matchLength;
  if (tzID == (UnicodeString *)0x0) {
    icu_63::UnicodeString::copyFrom(&this->id,mzID,'\0');
  }
  else {
    icu_63::UnicodeString::copyFrom(&this->id,tzID,'\0');
  }
  this->isTZID = tzID != (UnicodeString *)0x0;
  return;
}

Assistant:

MatchInfo(UTimeZoneNameType nameType, int32_t matchLength, const UnicodeString* tzID, const UnicodeString* mzID) {
        this->nameType = nameType;
        this->matchLength = matchLength;
        if (tzID != NULL) {
            this->id.setTo(*tzID);
            this->isTZID = TRUE;
        } else {
            this->id.setTo(*mzID);
            this->isTZID = FALSE;
        }
    }